

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::
FunctionMockerBase<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::
PerformDefaultAction
          (FunctionMockerBase<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>
           *this,ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  bool bVar2;
  Action<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *this_00;
  runtime_error *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  OnCallSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *this_02;
  string message;
  long *local_50 [2];
  long local_40 [2];
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_02 = (OnCallSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *)
                0x0;
      break;
    }
    this_02 = (OnCallSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *)
              ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar2 = OnCallSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::Matches
                      (this_02,args);
  } while (!bVar2);
  if (this_02 !=
      (OnCallSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *)0x0) {
    this_00 = OnCallSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::
              GetAction(this_02);
    Action<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::Perform
              (this_00,args);
    return;
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_50);
  if (DefaultValue<TestResult>::value_ != 0) {
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)local_50);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }